

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsPrehistorikTrack(Track *track)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  vector<Sector,_std::allocator<Sector>_> *this;
  reference this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  uchar *puVar4;
  int iVar5;
  Data *data12;
  Sector *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Sector,_std::allocator<Sector>_> *__range1;
  bool found_12;
  Track *track_local;
  
  bVar1 = false;
  this = Track::sectors(track);
  __end1 = std::vector<Sector,_std::allocator<Sector>_>::begin(this);
  s = (Sector *)std::vector<Sector,_std::allocator<Sector>_>::end(this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                *)&s);
    if (!bVar2) {
      if (bVar1) {
        if (opt.debug != 0) {
          util::operator<<((LogHelper *)&util::cout,(char (*) [28])"detected Prehistorik track\n");
        }
        track_local._7_1_ = true;
      }
      else {
        track_local._7_1_ = false;
      }
      return track_local._7_1_;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
              operator*(&__end1);
    if ((this_00->datarate != _250K) || (this_00->encoding != MFM)) break;
    iVar3 = (this_00->header).size;
    bVar2 = Sector::has_baddatacrc(this_00);
    iVar5 = 2;
    if (bVar2) {
      iVar5 = 5;
    }
    if (iVar3 != iVar5) {
      return false;
    }
    if (((this_00->header).sector == 0xc) && ((this_00->header).size == 5)) {
      bVar1 = true;
      this_01 = &Sector::data_copy(this_00,0)->
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_01);
      iVar3 = memcmp(puVar4 + 0x1b,"Titus",5);
      if (iVar3 != 0) {
        return false;
      }
    }
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  }
  return false;
}

Assistant:

bool IsPrehistorikTrack(const Track& track)
{
    bool found_12{ false };

    for (auto& s : track.sectors())
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.size != (s.has_baddatacrc() ? 5 : 2))
            return false;

        // The 4K sector 12 contains the protection signature.
        if (s.header.sector == 12 && s.header.size == 5)
        {
            found_12 = true;

            auto& data12 = s.data_copy();
            if (memcmp(data12.data() + 0x1b, "Titus", 5))
                return false;
        }
    }

    if (!found_12)
        return false;

    if (opt.debug) util::cout << "detected Prehistorik track\n";
    return true;
}